

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O0

element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *
mapbox::eternal::impl::
bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>const*,mapbox::eternal::impl::compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>>
          (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
           *left,element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
                 *right,
          compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> *key)

{
  bool bVar1;
  less local_31;
  ulong local_30;
  size_t step;
  size_t count;
  compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> *key_local;
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
  *right_local;
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
  *left_local;
  
  step = ((long)right - (long)left) / 0x18;
  count = (size_t)key;
  right_local = left;
  while (step != 0) {
    local_30 = step >> 1;
    key_local = (compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> *)
                (right_local + local_30);
    bVar1 = less::operator()(&local_31,
                             (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
                              *)key_local,
                             (compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_>
                              *)count);
    if (bVar1) {
      right_local = (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
                     *)&key_local[1].hash;
      step = step - (local_30 + 1);
    }
    else {
      step = local_30;
    }
  }
  return right_local;
}

Assistant:

MAPBOX_ETERNAL_CONSTEXPR auto bound(Iterator left, Iterator right, const Key& key) noexcept {
    std::size_t count = std::size_t(right - left);
    while (count > 0) {
        const std::size_t step = count / 2;
        right = left + step;
        if (Compare()(*right, key)) {
            left = ++right;
            count -= step + 1;
        } else {
            count = step;
        }
    }
    return left;
}